

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_copy_to_ucol.h
# Opt level: O3

int __thiscall
Eigen::internal::SparseLUImpl<double,_int>::copy_to_ucol
          (SparseLUImpl<double,_int> *this,int jcol,int nseg,IndexVector *segrep,
          BlockIndexVector *repfnz,IndexVector *perm_r,BlockScalarVector *dense,GlobalLU_t *glu)

{
  Index *length;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  char *__function;
  int iVar11;
  ulong uVar12;
  int nbElts;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  if (((-1 < jcol) &&
      (lVar14 = (long)jcol,
      lVar14 < (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows)) &&
     (lVar13 = (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows, lVar14 < lVar13)) {
    nbElts = (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[lVar14];
    if (0 < nseg) {
      iVar1 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[lVar14];
      length = &glu->nzumax;
      uVar12 = (ulong)(uint)nseg;
      iVar10 = 0;
      do {
        if (((long)uVar12 < 1) ||
           ((segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
            (long)uVar12)) goto LAB_0015033e;
        uVar12 = uVar12 - 1;
        uVar2 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                m_data[uVar12];
        lVar14 = (long)(int)uVar2;
        if ((lVar14 < 0) ||
           ((glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar14)) goto LAB_0015033e;
        iVar11 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[lVar14];
        if (iVar1 != iVar11) {
          if (*(long *)&(repfnz->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8 <= lVar14) {
            __function = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<int, -1, 1>>, Level = 1]"
            ;
            goto LAB_00150353;
          }
          iVar3 = *(int *)(*(long *)&repfnz->
                                     super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                          + lVar14 * 4);
          if (iVar3 != -1) {
            if ((iVar11 < 0) ||
               ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows <= (long)iVar11)) goto LAB_0015033e;
            iVar11 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[iVar11];
            lVar14 = (long)iVar11;
            if ((lVar14 < 0) ||
               ((glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows <= lVar14)) goto LAB_0015033e;
            iVar11 = (iVar3 - iVar11) +
                     (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[lVar14];
            while (*length < (int)((uVar2 - iVar3) + nbElts + 1)) {
              iVar9 = SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
                                ((SparseLUImpl<double,int> *)this,&glu->ucol,length,nbElts,0,
                                 &glu->num_expansions);
              if (iVar9 != 0) {
                return iVar9;
              }
              iVar9 = SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
                                ((SparseLUImpl<double,int> *)this,&glu->usub,length,nbElts,1,
                                 &glu->num_expansions);
              if (iVar9 != 0) {
                return iVar9;
              }
            }
            if (-1 < (int)(uVar2 - iVar3)) {
              piVar4 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              pdVar5 = (glu->ucol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              piVar6 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              piVar7 = (glu->usub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              lVar14 = (glu->ucol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              lVar13 = (long)iVar11;
              lVar15 = (long)nbElts;
              iVar9 = 0;
              do {
                if (((((iVar11 < 0) ||
                      ((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows <= lVar13)) || (lVar16 = (long)piVar4[lVar13], lVar16 < 0))
                    || (((perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows <= lVar16 || (nbElts < 0)))) ||
                   ((glu->usub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows <= lVar15)) goto LAB_0015033e;
                piVar7[lVar15] = piVar6[lVar16];
                if (*(long *)&(dense->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                              ).field_0x8 <= lVar16) {
                  __function = 
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                  ;
                  goto LAB_00150353;
                }
                if (lVar14 <= lVar15) {
                  __function = 
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                  ;
                  goto LAB_00150353;
                }
                lVar8 = *(long *)&dense->
                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ;
                pdVar5[lVar15] = *(double *)(lVar8 + lVar16 * 8);
                *(undefined8 *)(lVar8 + lVar16 * 8) = 0;
                lVar15 = lVar15 + 1;
                lVar13 = lVar13 + 1;
                iVar9 = iVar9 + -1;
              } while (~uVar2 + iVar3 != iVar9);
              nbElts = nbElts - iVar9;
            }
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != nseg);
      lVar13 = (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
    }
    if ((long)(ulong)(jcol + 1) < lVar13) {
      (glu->xusub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [jcol + 1] = nbElts;
      return 0;
    }
  }
LAB_0015033e:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
LAB_00150353:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,__function);
}

Assistant:

Index SparseLUImpl<Scalar,Index>::copy_to_ucol(const Index jcol, const Index nseg, IndexVector& segrep, BlockIndexVector repfnz ,IndexVector& perm_r, BlockScalarVector dense, GlobalLU_t& glu)
{  
  Index ksub, krep, ksupno; 
    
  Index jsupno = glu.supno(jcol);
  
  // For each nonzero supernode segment of U[*,j] in topological order 
  Index k = nseg - 1, i; 
  Index nextu = glu.xusub(jcol); 
  Index kfnz, isub, segsize; 
  Index new_next,irow; 
  Index fsupc, mem; 
  for (ksub = 0; ksub < nseg; ksub++)
  {
    krep = segrep(k); k--; 
    ksupno = glu.supno(krep); 
    if (jsupno != ksupno ) // should go into ucol(); 
    {
      kfnz = repfnz(krep); 
      if (kfnz != emptyIdxLU)
      { // Nonzero U-segment 
        fsupc = glu.xsup(ksupno); 
        isub = glu.xlsub(fsupc) + kfnz - fsupc; 
        segsize = krep - kfnz + 1; 
        new_next = nextu + segsize; 
        while (new_next > glu.nzumax) 
        {
          mem = memXpand<ScalarVector>(glu.ucol, glu.nzumax, nextu, UCOL, glu.num_expansions); 
          if (mem) return mem; 
          mem = memXpand<IndexVector>(glu.usub, glu.nzumax, nextu, USUB, glu.num_expansions); 
          if (mem) return mem; 
          
        }
        
        for (i = 0; i < segsize; i++)
        {
          irow = glu.lsub(isub); 
          glu.usub(nextu) = perm_r(irow); // Unlike the L part, the U part is stored in its final order
          glu.ucol(nextu) = dense(irow); 
          dense(irow) = Scalar(0.0); 
          nextu++;
          isub++;
        }
        
      } // end nonzero U-segment 
      
    } // end if jsupno 
    
  } // end for each segment
  glu.xusub(jcol + 1) = nextu; // close U(*,jcol)
  return 0; 
}